

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph_runtime.cc
# Opt level: O1

Module __thiscall
tvm::runtime::GraphRuntimeCreate
          (runtime *this,string *sym_json,Module *m,
          vector<DLContext,_std::allocator<DLContext>_> *ctxs)

{
  GraphRuntime *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Module MVar1;
  Module local_40;
  
  this_01 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x1d0);
  this_01->_M_use_count = 1;
  this_01->_M_weak_count = 1;
  this_01->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00149570;
  this_00 = (GraphRuntime *)(this_01 + 1);
  memset(this_00,0,0x1c0);
  this_01[1]._M_use_count = 0;
  this_01[1]._M_weak_count = 0;
  this_01[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[2]._M_use_count = 0;
  this_01[2]._M_weak_count = 0;
  this_01[3]._vptr__Sp_counted_base = (_func_int **)(this_01 + 6);
  this_01[3]._M_use_count = 1;
  this_01[3]._M_weak_count = 0;
  this_01[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[4]._M_use_count = 0;
  this_01[4]._M_weak_count = 0;
  *(undefined4 *)&this_01[5]._vptr__Sp_counted_base = 0x3f800000;
  this_01[5]._M_use_count = 0;
  this_01[5]._M_weak_count = 0;
  this_01[6]._vptr__Sp_counted_base = (_func_int **)0x0;
  this_01[1]._vptr__Sp_counted_base = (_func_int **)&PTR__GraphRuntime_001497c0;
  memset(&this_01[6]._M_use_count,0,0x168);
  local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (m->node_).super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (m->node_).super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  if (local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  GraphRuntime::Init(this_00,sym_json,&local_40,ctxs);
  if (local_40.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.node_.
               super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  *(GraphRuntime **)this = this_00;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = this_01;
  if (__libc_single_threaded == '\0') {
    LOCK();
    this_01->_M_use_count = this_01->_M_use_count + 1;
    UNLOCK();
  }
  else {
    this_01->_M_use_count = this_01->_M_use_count + 1;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  MVar1.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  MVar1.node_.super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (Module)MVar1.node_.
                 super___shared_ptr<tvm::runtime::ModuleNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Module GraphRuntimeCreate(const std::string &sym_json,
                          const tvm::runtime::Module &m,
                          const std::vector<TVMContext> &ctxs) {
  std::shared_ptr<GraphRuntime> exec = std::make_shared<GraphRuntime>();
  exec->Init(sym_json, m, ctxs);
  return Module(exec);
}